

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Counter.cpp
# Opt level: O0

int32_t __thiscall aeron::Counter::state(Counter *this)

{
  int32_t iVar1;
  CountersReader *this_00;
  AtomicCounter *in_RDI;
  
  this_00 = ClientConductor::countersReader((ClientConductor *)in_RDI[1]._vptr_AtomicCounter);
  concurrent::AtomicCounter::id(in_RDI);
  iVar1 = concurrent::CountersReader::getCounterState(this_00,(int32_t)((ulong)in_RDI >> 0x20));
  return iVar1;
}

Assistant:

std::int32_t Counter::state() const
{
    return m_clientConductor->countersReader().getCounterState(id());
}